

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<const_kj::ReadableDirectory>::dispose(Own<const_kj::ReadableDirectory> *this)

{
  ReadableDirectory *object;
  ReadableDirectory *ptrCopy;
  Own<const_kj::ReadableDirectory> *this_local;
  
  object = this->ptr;
  if (object != (ReadableDirectory *)0x0) {
    this->ptr = (ReadableDirectory *)0x0;
    Disposer::dispose<kj::ReadableDirectory>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }